

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O1

InstructionAtom * __thiscall Instruction::get_imm_src(Instruction *this)

{
  ulong uVar1;
  InstructionAtom *in_RAX;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar2 = (ulong)this->n_src;
  bVar4 = uVar2 != 0;
  if ((bVar4) && (in_RAX = this->src, in_RAX->kind != IMM)) {
    in_RAX = this->src;
    uVar1 = 1;
    do {
      uVar3 = uVar1;
      in_RAX = in_RAX + 1;
      if (uVar2 == uVar3) {
        in_RAX = in_RAX + -1;
        break;
      }
      uVar1 = uVar3 + 1;
    } while (in_RAX->kind != IMM);
    bVar4 = uVar3 < uVar2;
  }
  if (!bVar4) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Disasm/Instruction.cpp"
                  ,0xf1,"InstructionAtom &Instruction::get_imm_src()");
  }
  return in_RAX;
}

Assistant:

InstructionAtom& Instruction::get_imm_src() {
  for (int i = 0; i < n_src; i++) {
    if (src[i].kind == InstructionAtom::IMM) {
      return src[i];
    }
  }
  assert(false);
  return src[0];
}